

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkCreateConeArray(Abc_Ntk_t *pNtk,Vec_Ptr_t *vRoots,int fUseAllCis)

{
  Abc_Aig_t *pMan;
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar5;
  long lVar6;
  int iVar7;
  char Buffer [1000];
  
  if ((pNtk->ntkType & ~ABC_NTK_NETLIST) != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                  ,0x3b4,"Abc_Ntk_t *Abc_NtkCreateConeArray(Abc_Ntk_t *, Vec_Ptr_t *, int)");
  }
  pNtk_00 = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
  iVar7 = 0;
  sprintf(Buffer,"%s_part",pNtk->pName);
  pcVar2 = Extra_UtilStrsav(Buffer);
  pNtk_00->pName = pcVar2;
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pAVar3 = Abc_AigConst1(pNtk_00);
    pAVar4 = Abc_AigConst1(pNtk);
    (pAVar4->field_6).pCopy = pAVar3;
  }
  p = Abc_NtkDfsNodes(pNtk,(Abc_Obj_t **)vRoots->pArray,vRoots->nSize);
  do {
    if (pNtk->vCis->nSize <= iVar7) {
      for (iVar7 = 0; iVar7 < p->nSize; iVar7 = iVar7 + 1) {
        pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar7);
        if (pNtk->ntkType == ABC_NTK_STRASH) {
          pMan = (Abc_Aig_t *)pNtk_00->pManFunc;
          pAVar4 = Abc_ObjChild0Copy(pAVar3);
          pAVar5 = Abc_ObjChild1Copy(pAVar3);
          pAVar4 = Abc_AigAnd(pMan,pAVar4,pAVar5);
          (pAVar3->field_6).pCopy = pAVar4;
        }
        else {
          Abc_NtkDupObj(pNtk_00,pAVar3,0);
          for (lVar6 = 0; lVar6 < (pAVar3->vFanins).nSize; lVar6 = lVar6 + 1) {
            Abc_ObjAddFanin((pAVar3->field_6).pCopy,
                            *(Abc_Obj_t **)
                             ((long)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar6]] +
                             0x40));
          }
        }
      }
      Vec_PtrFree(p);
      for (iVar7 = 0; iVar7 < vRoots->nSize; iVar7 = iVar7 + 1) {
        pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(vRoots,iVar7);
        pAVar4 = Abc_NtkCreatePo(pNtk_00);
        if ((*(uint *)&pAVar3->field_0x14 & 0xf) - 5 < 0xfffffffe) {
          pAVar5 = (pAVar3->field_6).pCopy;
        }
        else {
          pAVar5 = Abc_ObjChild0Copy(pAVar3);
        }
        Abc_ObjAddFanin(pAVar4,pAVar5);
        pcVar2 = Abc_ObjName(pAVar3);
        Abc_ObjAssignName(pAVar4,pcVar2,(char *)0x0);
      }
      iVar7 = Abc_NtkCheck(pNtk_00);
      if (iVar7 == 0) {
        fwrite("Abc_NtkCreateConeArray(): Network check has failed.\n",0x34,1,_stdout);
      }
      return pNtk_00;
    }
    pAVar3 = Abc_NtkCi(pNtk,iVar7);
    if (fUseAllCis == 0) {
      iVar1 = Abc_NodeIsTravIdCurrent(pAVar3);
      if (iVar1 != 0) goto LAB_006c4ca5;
    }
    else {
LAB_006c4ca5:
      pAVar4 = Abc_NtkCreatePi(pNtk_00);
      (pAVar3->field_6).pCopy = pAVar4;
      pcVar2 = Abc_ObjName(pAVar3);
      Abc_ObjAssignName(pAVar4,pcVar2,(char *)0x0);
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkCreateConeArray( Abc_Ntk_t * pNtk, Vec_Ptr_t * vRoots, int fUseAllCis )
{
    Abc_Ntk_t * pNtkNew; 
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanin, * pNodeCoNew;
    char Buffer[1000];
    int i, k;

    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk) );
    
    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // set the name
    sprintf( Buffer, "%s_part", pNtk->pName );
    pNtkNew->pName = Extra_UtilStrsav(Buffer);

    // establish connection between the constant nodes
    if ( Abc_NtkIsStrash(pNtk) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);

    // collect the nodes in the TFI of the output (mark the TFI)
    vNodes = Abc_NtkDfsNodes( pNtk, (Abc_Obj_t **)Vec_PtrArray(vRoots), Vec_PtrSize(vRoots) );

    // create the PIs
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( fUseAllCis || Abc_NodeIsTravIdCurrent(pObj) ) // TravId is set by DFS
        {
            pObj->pCopy = Abc_NtkCreatePi(pNtkNew);
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
        }
    }

    // copy the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        // if it is an AIG, add to the hash table
        if ( Abc_NtkIsStrash(pNtk) )
        {
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
        }
        else
        {
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
        }
    }
    Vec_PtrFree( vNodes );

    // add the POs corresponding to the root nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vRoots, pObj, i )
    {
        // create the PO node
        pNodeCoNew = Abc_NtkCreatePo( pNtkNew );
        // connect the internal nodes to the new CO
        if ( Abc_ObjIsCo(pObj) )
            Abc_ObjAddFanin( pNodeCoNew, Abc_ObjChild0Copy(pObj) );
        else
            Abc_ObjAddFanin( pNodeCoNew, pObj->pCopy );
        // assign the name
        Abc_ObjAssignName( pNodeCoNew, Abc_ObjName(pObj), NULL );
    }

    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkCreateConeArray(): Network check has failed.\n" );
    return pNtkNew;
}